

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddPriority.c
# Opt level: O1

DdNode * cuddBddClosestCube(DdManager *dd,DdNode *f,DdNode *g,double bound)

{
  int *piVar1;
  DdNode *pDVar2;
  bool bVar3;
  DdNode *pDVar4;
  DdNode *g_00;
  DdNode *pDVar5;
  DdNode *n;
  DdNode *f_00;
  uint uVar6;
  uint index;
  uint uVar7;
  uint uVar8;
  uint *puVar9;
  double dVar10;
  DdNode *pDVar11;
  DdNode *pDVar12;
  double det;
  double dte;
  double dee;
  double dtt;
  DdNode *local_b0;
  DdNode *local_78;
  DdNode *local_70;
  uint *local_68;
  DdNode *local_60;
  DdNode *local_58;
  DdNode *local_50;
  DdNode *local_48;
  DdNode *local_40;
  uint *local_38;
  
  if ((DdNode *)((ulong)g ^ 1) == f) {
    dVar10 = 1.0;
  }
  else {
    dVar10 = 0.0;
  }
  pDVar2 = dd->zero;
  if (bound < dVar10) {
    return pDVar2;
  }
  pDVar4 = dd->one;
  if ((DdNode *)((ulong)pDVar4 ^ 1) == f || (DdNode *)((ulong)pDVar4 ^ 1) == g) {
    return pDVar2;
  }
  if (pDVar4 == g && pDVar4 == f) {
    return pDVar4;
  }
  local_68 = (uint *)((ulong)f & 0xfffffffffffffffe);
  puVar9 = (uint *)((ulong)g & 0xfffffffffffffffe);
  if (((local_68[1] != 1) || (puVar9[1] != 1)) &&
     (pDVar4 = cuddCacheLookup2(dd,Cudd_bddClosestCube,f,g), pDVar4 != (DdNode *)0x0)) {
    return pDVar4;
  }
  uVar6 = *local_68;
  uVar7 = 0x7fffffff;
  uVar8 = 0x7fffffff;
  if ((ulong)uVar6 != 0x7fffffff) {
    uVar8 = dd->perm[uVar6];
  }
  index = *puVar9;
  if ((ulong)index != 0x7fffffff) {
    uVar7 = dd->perm[index];
  }
  local_58 = f;
  pDVar4 = f;
  if (uVar8 <= uVar7) {
    pDVar4 = *(DdNode **)(local_68 + 4);
    local_58 = *(DdNode **)(local_68 + 6);
    index = uVar6;
    if (((ulong)f & 1) != 0) {
      pDVar4 = (DdNode *)((ulong)pDVar4 ^ 1);
      local_58 = (DdNode *)((ulong)local_58 ^ 1);
    }
  }
  g_00 = g;
  local_60 = g;
  if (uVar7 <= uVar8) {
    local_60 = *(DdNode **)(puVar9 + 4);
    g_00 = *(DdNode **)(puVar9 + 6);
    if (((ulong)g & 1) != 0) {
      local_60 = (DdNode *)((ulong)local_60 ^ 1);
      g_00 = (DdNode *)((ulong)g_00 ^ 1);
    }
  }
  local_38 = puVar9;
  pDVar5 = cuddBddClosestCube(dd,pDVar4,local_60,bound);
  if (pDVar5 == (DdNode *)0x0) {
    return (DdNode *)0x0;
  }
  piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + 1;
  n = separateCube(dd,pDVar5,(double *)&local_48);
  if (n == (DdNode *)0x0) goto LAB_0078a684;
  piVar1 = (int *)(((ulong)n & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + 1;
  Cudd_RecursiveDeref(dd,pDVar5);
  local_40 = local_48;
  local_b0 = local_48;
  if (bound <= (double)local_48) {
    local_b0 = (DdNode *)bound;
  }
  f_00 = cuddBddClosestCube(dd,local_58,g_00,(double)local_b0);
  pDVar5 = n;
  if (f_00 == (DdNode *)0x0) goto LAB_0078a684;
  piVar1 = (int *)(((ulong)f_00 & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + 1;
  pDVar5 = separateCube(dd,f_00,(double *)&local_50);
  if (pDVar5 == (DdNode *)0x0) {
    Cudd_RecursiveDeref(dd,n);
    pDVar5 = f_00;
    goto LAB_0078a684;
  }
  piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + 1;
  Cudd_RecursiveDeref(dd,f_00);
  pDVar12 = local_50;
  if ((double)local_40 <= (double)local_50) {
    pDVar12 = local_40;
  }
  pDVar11 = local_b0;
  if (((double)pDVar12 <= 2147483647.0) &&
     (pDVar11 = (DdNode *)((double)pDVar12 + -1.0), (double)local_b0 <= (double)pDVar12 + -1.0)) {
    pDVar11 = local_b0;
  }
  if (((double)pDVar12 <= 0.0) || (uVar8 != uVar7)) {
    piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    local_70 = (DdNode *)0x41e0000000000000;
    f_00 = pDVar2;
  }
  else {
    pDVar4 = cuddBddClosestCube(dd,pDVar4,g_00,(double)pDVar11 + -1.0);
    if (pDVar4 == (DdNode *)0x0) {
      Cudd_RecursiveDeref(dd,n);
      Cudd_RecursiveDeref(dd,pDVar5);
LAB_0078a7a4:
      bVar3 = false;
    }
    else {
      piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      f_00 = separateCube(dd,pDVar4,(double *)&local_70);
      if (f_00 == (DdNode *)0x0) {
        Cudd_RecursiveDeref(dd,n);
        Cudd_RecursiveDeref(dd,pDVar5);
        Cudd_RecursiveDeref(dd,pDVar4);
        f_00 = (DdNode *)0x0;
        goto LAB_0078a7a4;
      }
      piVar1 = (int *)(((ulong)f_00 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      Cudd_RecursiveDeref(dd,pDVar4);
      local_70 = (DdNode *)((double)local_70 + 1.0);
      pDVar4 = local_70;
      if ((double)pDVar12 <= (double)local_70) {
        pDVar4 = pDVar12;
      }
      bVar3 = true;
      pDVar12 = pDVar4;
    }
    local_b0 = pDVar11;
    if (!bVar3) {
      return (DdNode *)0x0;
    }
  }
  pDVar4 = pDVar11;
  if (((double)pDVar12 <= 2147483647.0) &&
     (pDVar4 = (DdNode *)((double)pDVar12 + -1.0), (double)pDVar11 <= (double)pDVar12 + -1.0)) {
    pDVar4 = pDVar11;
  }
  if (((double)pDVar12 <= 0.0) || (uVar8 != uVar7)) {
    piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    local_78 = (DdNode *)0x41e0000000000000;
    local_b0 = pDVar2;
  }
  else {
    pDVar4 = cuddBddClosestCube(dd,local_58,local_60,(double)pDVar4 + -1.0);
    if (pDVar4 == (DdNode *)0x0) {
      Cudd_RecursiveDeref(dd,n);
      Cudd_RecursiveDeref(dd,pDVar5);
      Cudd_RecursiveDeref(dd,f_00);
LAB_0078a904:
      bVar3 = false;
    }
    else {
      piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      local_b0 = separateCube(dd,pDVar4,(double *)&local_78);
      if (local_b0 == (DdNode *)0x0) {
        Cudd_RecursiveDeref(dd,n);
        Cudd_RecursiveDeref(dd,pDVar5);
        Cudd_RecursiveDeref(dd,f_00);
        Cudd_RecursiveDeref(dd,pDVar4);
        local_b0 = (DdNode *)0x0;
        goto LAB_0078a904;
      }
      piVar1 = (int *)(((ulong)local_b0 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      Cudd_RecursiveDeref(dd,pDVar4);
      local_78 = (DdNode *)((double)local_78 + 1.0);
      pDVar4 = local_78;
      if ((double)pDVar12 <= (double)local_78) {
        pDVar4 = pDVar12;
      }
      bVar3 = true;
      pDVar12 = pDVar4;
    }
    if (!bVar3) {
      return (DdNode *)0x0;
    }
  }
  if (((double)pDVar12 != (double)local_48) || (NAN((double)pDVar12) || NAN((double)local_48))) {
    if (((double)pDVar12 != (double)local_50) || (NAN((double)pDVar12) || NAN((double)local_50))) {
      if (((double)pDVar12 != (double)local_70) || (NAN((double)pDVar12) || NAN((double)local_70)))
      {
        if (uVar8 != uVar7) {
          __assert_fail("topf == topg",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/cudd/cuddPriority.c"
                        ,0x708,"DdNode *cuddBddClosestCube(DdManager *, DdNode *, DdNode *, double)"
                       );
        }
        uVar6 = 0;
        pDVar4 = local_b0;
        local_48 = local_78;
      }
      else {
        if (uVar8 != uVar7) {
          __assert_fail("topf == topg",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/cudd/cuddPriority.c"
                        ,0x703,"DdNode *cuddBddClosestCube(DdManager *, DdNode *, DdNode *, double)"
                       );
        }
        uVar6 = 1;
        pDVar4 = f_00;
        local_48 = local_70;
      }
    }
    else {
      uVar6 = 0;
      pDVar4 = pDVar5;
      local_48 = local_50;
    }
  }
  else {
    if (n == pDVar5) {
      if (((double)local_48 == (double)local_50) &&
         (!NAN((double)local_48) && !NAN((double)local_50))) {
        index = 0x7fffffff;
      }
    }
    uVar6 = 1;
    pDVar4 = n;
  }
  pDVar4 = createResult(dd,index,uVar6,pDVar4,(double)local_48);
  if (pDVar4 != (DdNode *)0x0) {
    piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    Cudd_RecursiveDeref(dd,n);
    Cudd_RecursiveDeref(dd,pDVar5);
    Cudd_RecursiveDeref(dd,f_00);
    Cudd_RecursiveDeref(dd,local_b0);
    if (((local_68[1] != 1) || (local_38[1] != 1)) && (pDVar4 != pDVar2)) {
      cuddCacheInsert2(dd,Cudd_bddClosestCube,f,g,pDVar4);
    }
    piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + -1;
    return pDVar4;
  }
  Cudd_RecursiveDeref(dd,n);
  Cudd_RecursiveDeref(dd,pDVar5);
  Cudd_RecursiveDeref(dd,f_00);
  pDVar5 = local_b0;
LAB_0078a684:
  Cudd_RecursiveDeref(dd,pDVar5);
  return (DdNode *)0x0;
}

Assistant:

DdNode *
cuddBddClosestCube(
  DdManager *dd,
  DdNode *f,
  DdNode *g,
  CUDD_VALUE_TYPE bound)
{
    DdNode *res, *F, *G, *ft, *fe, *gt, *ge, *tt, *ee;
    DdNode *ctt, *cee, *cte, *cet;
    CUDD_VALUE_TYPE minD, dtt, dee, dte, det;
    DdNode *one = DD_ONE(dd);
    DdNode *lzero = Cudd_Not(one);
    DdNode *azero = DD_ZERO(dd);
    unsigned int topf, topg, index;

    statLine(dd);
    if (bound < (int)(f == Cudd_Not(g))) return(azero);
    /* Terminal cases. */
    if (g == lzero || f == lzero) return(azero);
    if (f == one && g == one) return(one);

    /* Check cache. */
    F = Cudd_Regular(f);
    G = Cudd_Regular(g);
    if (F->ref != 1 || G->ref != 1) {
        res = cuddCacheLookup2(dd,(DD_CTFP) Cudd_bddClosestCube, f, g);
        if (res != NULL) return(res);
    }

    topf = cuddI(dd,F->index);
    topg = cuddI(dd,G->index);

    /* Compute cofactors. */
    if (topf <= topg) {
        index = F->index;
        ft = cuddT(F);
        fe = cuddE(F);
        if (Cudd_IsComplement(f)) {
            ft = Cudd_Not(ft);
            fe = Cudd_Not(fe);
        }
    } else {
        index = G->index;
        ft = fe = f;
    }

    if (topg <= topf) {
        gt = cuddT(G);
        ge = cuddE(G);
        if (Cudd_IsComplement(g)) {
            gt = Cudd_Not(gt);
            ge = Cudd_Not(ge);
        }
    } else {
        gt = ge = g;
    }

    tt = cuddBddClosestCube(dd,ft,gt,bound);
    if (tt == NULL) return(NULL);
    cuddRef(tt);
    ctt = separateCube(dd,tt,&dtt);
    if (ctt == NULL) {
        Cudd_RecursiveDeref(dd, tt);
        return(NULL);
    }
    cuddRef(ctt);
    Cudd_RecursiveDeref(dd, tt);
    minD = dtt;
    bound = ddMin(bound,minD);

    ee = cuddBddClosestCube(dd,fe,ge,bound);
    if (ee == NULL) {
        Cudd_RecursiveDeref(dd, ctt);
        return(NULL);
    }
    cuddRef(ee);
    cee = separateCube(dd,ee,&dee);
    if (cee == NULL) {
        Cudd_RecursiveDeref(dd, ctt);
        Cudd_RecursiveDeref(dd, ee);
        return(NULL);
    }
    cuddRef(cee);
    Cudd_RecursiveDeref(dd, ee);
    minD = ddMin(dtt, dee);
    if (minD <= CUDD_CONST_INDEX) bound = ddMin(bound,minD-1);

    if (minD > 0 && topf == topg) {
        DdNode *te = cuddBddClosestCube(dd,ft,ge,bound-1);
        if (te == NULL) {
            Cudd_RecursiveDeref(dd, ctt);
            Cudd_RecursiveDeref(dd, cee);
            return(NULL);
        }
        cuddRef(te);
        cte = separateCube(dd,te,&dte);
        if (cte == NULL) {
            Cudd_RecursiveDeref(dd, ctt);
            Cudd_RecursiveDeref(dd, cee);
            Cudd_RecursiveDeref(dd, te);
            return(NULL);
        }
        cuddRef(cte);
        Cudd_RecursiveDeref(dd, te);
        dte += 1.0;
        minD = ddMin(minD, dte);
    } else {
        cte = azero;
        cuddRef(cte);
        dte = CUDD_CONST_INDEX + 1.0;
    }
    if (minD <= CUDD_CONST_INDEX) bound = ddMin(bound,minD-1);

    if (minD > 0 && topf == topg) {
        DdNode *et = cuddBddClosestCube(dd,fe,gt,bound-1);
        if (et == NULL) {
            Cudd_RecursiveDeref(dd, ctt);
            Cudd_RecursiveDeref(dd, cee);
            Cudd_RecursiveDeref(dd, cte);
            return(NULL);
        }
        cuddRef(et);
        cet = separateCube(dd,et,&det);
        if (cet == NULL) {
            Cudd_RecursiveDeref(dd, ctt);
            Cudd_RecursiveDeref(dd, cee);
            Cudd_RecursiveDeref(dd, cte);
            Cudd_RecursiveDeref(dd, et);
            return(NULL);
        }
        cuddRef(cet);
        Cudd_RecursiveDeref(dd, et);
        det += 1.0;
        minD = ddMin(minD, det);
    } else {
        cet = azero;
        cuddRef(cet);
        det = CUDD_CONST_INDEX + 1.0;
    }

    if (minD == dtt) {
        if (dtt == dee && ctt == cee) {
            res = createResult(dd,CUDD_CONST_INDEX,1,ctt,dtt);
        } else {
            res = createResult(dd,index,1,ctt,dtt);
        }
    } else if (minD == dee) {
        res = createResult(dd,index,0,cee,dee);
    } else if (minD == dte) {
#ifdef DD_DEBUG
        assert(topf == topg);
#endif
        res = createResult(dd,index,1,cte,dte);
    } else {
#ifdef DD_DEBUG
        assert(topf == topg);
#endif
        res = createResult(dd,index,0,cet,det);
    }
    if (res == NULL) {
        Cudd_RecursiveDeref(dd, ctt);
        Cudd_RecursiveDeref(dd, cee);
        Cudd_RecursiveDeref(dd, cte);
        Cudd_RecursiveDeref(dd, cet);
        return(NULL);
    }
    cuddRef(res);
    Cudd_RecursiveDeref(dd, ctt);
    Cudd_RecursiveDeref(dd, cee);
    Cudd_RecursiveDeref(dd, cte);
    Cudd_RecursiveDeref(dd, cet);

    /* Only cache results that are different from azero to avoid
    ** storing results that depend on the value of the bound. */
    if ((F->ref != 1 || G->ref != 1) && res != azero)
        cuddCacheInsert2(dd,(DD_CTFP) Cudd_bddClosestCube, f, g, res);

    cuddDeref(res);
    return(res);

}